

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

void __thiscall AddrManImpl::Check(AddrManImpl *this)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int err;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_consistency_check_ratio != 0) {
    uVar1 = 0x20;
    uVar3 = this->m_consistency_check_ratio - 1;
    if (uVar3 != 0) {
      uVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
    }
    do {
      uVar2 = RandomMixin<FastRandomContext>::randbits
                        (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,0x20 - uVar1);
    } while (uVar3 < uVar2);
    if ((int)uVar2 < 1) {
      err = CheckAddrman(this);
      if (err != 0) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
        ;
        source_file._M_len = 0x5b;
        logging_function._M_str = "Check";
        logging_function._M_len = 5;
        LogPrintFormatInternal<int>
                  (logging_function,source_file,0x41f,ALL,Info,(ConstevalFormatString<1U>)0xf6d11e,
                   &err);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ,0x420,"void AddrManImpl::Check() const");
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Check() const
{
    AssertLockHeld(cs);

    // Run consistency checks 1 in m_consistency_check_ratio times if enabled
    if (m_consistency_check_ratio == 0) return;
    if (insecure_rand.randrange(m_consistency_check_ratio) >= 1) return;

    const int err{CheckAddrman()};
    if (err) {
        LogPrintf("ADDRMAN CONSISTENCY CHECK FAILED!!! err=%i\n", err);
        assert(false);
    }
}